

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceAABB.h
# Opt level: O0

void __thiscall IceMaths::AABB::SetMinMax(AABB *this,Point *min,Point *max)

{
  float fVar1;
  float fVar2;
  undefined8 local_140;
  undefined8 local_11c;
  Point *max_local;
  Point *min_local;
  AABB *this_local;
  
  fVar1 = max->z;
  fVar2 = min->z;
  local_11c._0_4_ = (max->x + min->x) * 0.5;
  local_11c._4_4_ = (max->y + min->y) * 0.5;
  local_11c._0_4_ = (float)local_11c;
  local_11c._4_4_ = SUB84(local_11c,4);
  (this->mCenter).x = (float)local_11c;
  (this->mCenter).y = local_11c._4_4_;
  (this->mCenter).z = (fVar1 + fVar2) * 0.5;
  fVar1 = max->z;
  fVar2 = min->z;
  local_140._0_4_ = (max->x - min->x) * 0.5;
  local_140._4_4_ = (max->y - min->y) * 0.5;
  local_140._0_4_ = (float)local_140;
  local_140._4_4_ = SUB84(local_140,4);
  (this->mExtents).x = (float)local_140;
  (this->mExtents).y = local_140._4_4_;
  (this->mExtents).z = (fVar1 - fVar2) * 0.5;
  return;
}

Assistant:

void		SetMinMax(const Point& min, const Point& max)		{ mCenter = (max + min)*0.5f; mExtents = (max - min)*0.5f;		}